

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-fns.cpp
# Opt level: O0

float reference_quantization_error
                (ggml_type_traits *qfns,ggml_type_traits_cpu *qfns_cpu,size_t test_size,
                float *test_data)

{
  uchar *puVar1;
  float *a1;
  float *pfVar2;
  vector<float,_std::allocator<float>_> *this;
  float *pfVar3;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  float fVar4;
  vector<float,_std::allocator<float>_> tmp_out_ref;
  vector<float,_std::allocator<float>_> tmp_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_q;
  allocator_type *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  code *pcVar5;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff10;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x103f4c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08,(allocator_type *)in_stack_ffffffffffffff00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x103f75);
  std::allocator<float>::allocator((allocator<float> *)0x103f94);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::allocator<float>::~allocator((allocator<float> *)0x103fba);
  std::allocator<float>::allocator((allocator<float> *)0x103fd9);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::allocator<float>::~allocator((allocator<float> *)0x103fff);
  pcVar5 = (code *)*in_RSI;
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x104029);
  (*pcVar5)(in_RCX,puVar1,in_RDX);
  pcVar5 = *(code **)(in_RDI + 0x28);
  a1 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x104060);
  pfVar2 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x104072);
  (*pcVar5)(a1,pfVar2,in_RDX);
  pfVar2 = *(float **)(in_RDI + 0x30);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1040b6);
  (*(code *)pfVar2)(in_RCX,puVar1,in_RDX);
  pcVar5 = *(code **)(in_RDI + 0x28);
  this = (vector<float,_std::allocator<float>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1040ed);
  pfVar3 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x1040ff);
  (*pcVar5)(this,pfVar3,in_RDX);
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x104125);
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x104137);
  fVar4 = array_rmse(a1,pfVar2,in_RCX);
  std::vector<float,_std::allocator<float>_>::~vector(this);
  std::vector<float,_std::allocator<float>_>::~vector(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return fVar4;
}

Assistant:

static float reference_quantization_error(const ggml_type_traits * qfns, const ggml_type_traits_cpu * qfns_cpu, size_t test_size, const float * test_data) {
    std::vector<uint8_t> tmp_q(2*test_size);
    std::vector<float> tmp_out(test_size);
    std::vector<float> tmp_out_ref(test_size);

    // FIXME: why is done twice?
    qfns_cpu->from_float(test_data, tmp_q.data(), test_size);
    qfns->to_float(tmp_q.data(), tmp_out.data(), test_size);

    qfns->from_float_ref(test_data, tmp_q.data(), test_size);
    qfns->to_float(tmp_q.data(), tmp_out_ref.data(), test_size);

    return array_rmse(tmp_out.data(), tmp_out_ref.data(), test_size);
}